

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall AbstractModuleClient::getAvailableTrodesData(AbstractModuleClient *this,string *data)

{
  ulong uVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  size_type sVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  NTrodeObj *nt_2;
  iterator __end6_1;
  iterator __begin6_1;
  vector<NTrodeObj,_std::allocator<NTrodeObj>_> *__range6_1;
  NDeviceChannel *ch_2;
  iterator __end6;
  iterator __begin6;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *__range6;
  NDevice *dv_1;
  iterator __end5_1;
  iterator __begin5_1;
  vector<NDevice,_std::allocator<NDevice>_> *__range5_1;
  NDeviceChannel *ch_1;
  iterator __end5;
  iterator __begin5;
  vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *__range5;
  NDevice *dv;
  iterator __end4;
  iterator __begin4;
  vector<NDevice,_std::allocator<NDevice>_> *__range4;
  NTrodeObj *nt_1;
  iterator __end3;
  iterator __begin3;
  vector<NTrodeObj,_std::allocator<NTrodeObj>_> *__range3;
  size_t ch;
  NTrodeObj *nt;
  iterator __end2;
  iterator __begin2;
  vector<NTrodeObj,_std::allocator<NTrodeObj>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list;
  MlmWrap *in_stack_fffffffffffff9d8;
  TrodesConfig *in_stack_fffffffffffff9e0;
  TrodesConfig *this_00;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff9ec;
  vector<NDevice,_std::allocator<NDevice>_> *in_stack_fffffffffffff9f0;
  allocator *paVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  string local_5a0 [32];
  string local_580 [32];
  reference local_560;
  NTrodeObj *local_558;
  __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_> local_550 [8];
  undefined1 local_510 [24];
  undefined1 *local_4f8;
  undefined1 local_4e9 [33];
  string local_4c8 [32];
  string local_4a8 [32];
  string local_488 [32];
  string local_468 [32];
  reference local_448;
  NDeviceChannel *local_440;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  local_438;
  undefined1 local_430 [24];
  undefined1 *local_418;
  reference local_410;
  NDevice *local_408;
  __normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_> local_400 [8];
  undefined1 local_3c0 [24];
  undefined1 *local_3a8;
  allocator local_399;
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  reference local_2f8;
  NDeviceChannel *local_2f0;
  __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
  local_2e8;
  undefined1 local_2e0 [24];
  undefined1 *local_2c8;
  reference local_2c0;
  undefined4 local_2b4;
  NDevice *local_2b0;
  __normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_> local_2a8 [8];
  undefined1 local_268 [24];
  undefined1 *local_250;
  allocator local_241;
  string local_240 [32];
  string local_220 [32];
  reference local_200;
  NTrodeObj *local_1f8;
  __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_> local_1f0 [8];
  undefined1 local_1b0 [24];
  undefined1 *local_198;
  allocator local_189;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  vector<int,_std::allocator<int>_> local_e8;
  ulong local_d0;
  reference local_c8;
  NTrodeObj *local_c0;
  __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_> local_b8 [8];
  undefined1 local_78 [24];
  undefined1 *local_60;
  allocator local_51;
  string local_50 [55];
  undefined1 local_19;
  
  local_19 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1bccab);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Format: \'ntrode_id, nth channel\'",&local_51);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff9e0,(value_type *)in_stack_fffffffffffff9d8);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    MlmWrap::getTrodesConfig(in_stack_fffffffffffff9d8);
    TrodesConfig::getNTrodes((TrodesConfig *)in_stack_fffffffffffff9d8);
    TrodesConfig::~TrodesConfig(in_stack_fffffffffffff9e0);
    local_60 = local_78;
    local_b8[0]._M_current =
         (NTrodeObj *)
         std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::begin
                   ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffff9d8);
    local_c0 = (NTrodeObj *)
               std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::end
                         ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffff9d8
                         );
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                               *)in_stack_fffffffffffff9e0,
                              (__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                               *)in_stack_fffffffffffff9d8), bVar2) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                 ::operator*(local_b8);
      local_d0 = 0;
      while( true ) {
        uVar1 = local_d0;
        NTrodeObj::getHw_chans((NTrodeObj *)in_stack_fffffffffffff9d8);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_e8);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f0);
        if (sVar5 <= uVar1) break;
        NTrodeObj::getId_abi_cxx11_((NTrodeObj *)in_stack_fffffffffffff9d8);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                       (char *)in_stack_fffffffffffff9e0);
        std::__cxx11::to_string(CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                       in_stack_fffffffffffffa10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff9e0,(value_type *)in_stack_fffffffffffff9d8);
        std::__cxx11::string::~string(local_108);
        std::__cxx11::string::~string(local_168);
        std::__cxx11::string::~string(local_128);
        std::__cxx11::string::~string(local_148);
        local_d0 = local_d0 + 1;
      }
      __gnu_cxx::__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
      ::operator++(local_b8);
    }
    std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
              ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffff9f0);
  }
  else {
    uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8);
    if ((bool)uVar3) {
      paVar7 = &local_189;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_188,"Format: \'ntrode_id\'",paVar7);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff9e0,(value_type *)in_stack_fffffffffffff9d8);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      MlmWrap::getTrodesConfig(in_stack_fffffffffffff9d8);
      TrodesConfig::getNTrodes((TrodesConfig *)in_stack_fffffffffffff9d8);
      TrodesConfig::~TrodesConfig(in_stack_fffffffffffff9e0);
      local_198 = local_1b0;
      local_1f0[0]._M_current =
           (NTrodeObj *)
           std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::begin
                     ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffff9d8);
      local_1f8 = (NTrodeObj *)
                  std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::end
                            ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)
                             in_stack_fffffffffffff9d8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                                 *)in_stack_fffffffffffff9e0,
                                (__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                                 *)in_stack_fffffffffffff9d8), bVar2) {
        local_200 = __gnu_cxx::
                    __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                    ::operator*(local_1f0);
        NTrodeObj::getId_abi_cxx11_((NTrodeObj *)in_stack_fffffffffffff9d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff9e0,(value_type *)in_stack_fffffffffffff9d8);
        std::__cxx11::string::~string(local_220);
        __gnu_cxx::
        __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>::
        operator++(local_1f0);
      }
      std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
                ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffff9f0);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,"Format: \'Device_name, channel_id\'",&local_241);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff9e0,(value_type *)in_stack_fffffffffffff9d8);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        MlmWrap::getTrodesConfig(in_stack_fffffffffffff9d8);
        TrodesConfig::getDevices((TrodesConfig *)in_stack_fffffffffffff9d8);
        TrodesConfig::~TrodesConfig(in_stack_fffffffffffff9e0);
        local_250 = local_268;
        local_2a8[0]._M_current =
             (NDevice *)
             std::vector<NDevice,_std::allocator<NDevice>_>::begin
                       ((vector<NDevice,_std::allocator<NDevice>_> *)in_stack_fffffffffffff9d8);
        local_2b0 = (NDevice *)
                    std::vector<NDevice,_std::allocator<NDevice>_>::end
                              ((vector<NDevice,_std::allocator<NDevice>_> *)
                               in_stack_fffffffffffff9d8);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_>
                                   *)in_stack_fffffffffffff9e0,
                                  (__normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_>
                                   *)in_stack_fffffffffffff9d8), bVar2) {
          local_2c0 = __gnu_cxx::
                      __normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_>
                      ::operator*(local_2a8);
          NDevice::getChannels((NDevice *)in_stack_fffffffffffff9d8);
          local_2c8 = local_2e0;
          local_2e8._M_current =
               (NDeviceChannel *)
               std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::begin
                         ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                          in_stack_fffffffffffff9d8);
          local_2f0 = (NDeviceChannel *)
                      std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::end
                                ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                                 in_stack_fffffffffffff9d8);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                                     *)in_stack_fffffffffffff9e0,
                                    (__normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                                     *)in_stack_fffffffffffff9d8), bVar2) {
            local_2f8 = __gnu_cxx::
                        __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                        ::operator*(&local_2e8);
            iVar4 = NDeviceChannel::getType(local_2f8);
            if (iVar4 == 1) {
              NDevice::getName_abi_cxx11_((NDevice *)in_stack_fffffffffffff9d8);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                             (char *)in_stack_fffffffffffff9e0);
              NDeviceChannel::getId_abi_cxx11_((NDeviceChannel *)in_stack_fffffffffffff9d8);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(uVar3,in_stack_fffffffffffffa18),in_stack_fffffffffffffa10);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff9e0,(value_type *)in_stack_fffffffffffff9d8);
              std::__cxx11::string::~string(local_318);
              std::__cxx11::string::~string(local_378);
              std::__cxx11::string::~string(local_338);
              std::__cxx11::string::~string(local_358);
            }
            __gnu_cxx::
            __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
            ::operator++(&local_2e8);
          }
          local_2b4 = 0xb;
          std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector
                    ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                     in_stack_fffffffffffff9f0);
          __gnu_cxx::__normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_>::
          operator++(local_2a8);
        }
        local_2b4 = 9;
        std::vector<NDevice,_std::allocator<NDevice>_>::~vector(in_stack_fffffffffffff9f0);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8);
        if (bVar2) {
          paVar7 = &local_399;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_398,"Format: \'Device_name, channel_id\'",paVar7);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff9e0,(value_type *)in_stack_fffffffffffff9d8);
          std::__cxx11::string::~string(local_398);
          std::allocator<char>::~allocator((allocator<char> *)&local_399);
          MlmWrap::getTrodesConfig(in_stack_fffffffffffff9d8);
          TrodesConfig::getDevices((TrodesConfig *)in_stack_fffffffffffff9d8);
          TrodesConfig::~TrodesConfig(in_stack_fffffffffffff9e0);
          local_3a8 = local_3c0;
          local_400[0]._M_current =
               (NDevice *)
               std::vector<NDevice,_std::allocator<NDevice>_>::begin
                         ((vector<NDevice,_std::allocator<NDevice>_> *)in_stack_fffffffffffff9d8);
          local_408 = (NDevice *)
                      std::vector<NDevice,_std::allocator<NDevice>_>::end
                                ((vector<NDevice,_std::allocator<NDevice>_> *)
                                 in_stack_fffffffffffff9d8);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_>
                                     *)in_stack_fffffffffffff9e0,
                                    (__normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_>
                                     *)in_stack_fffffffffffff9d8), bVar2) {
            local_410 = __gnu_cxx::
                        __normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_>
                        ::operator*(local_400);
            NDevice::getChannels((NDevice *)in_stack_fffffffffffff9d8);
            local_418 = local_430;
            local_438._M_current =
                 (NDeviceChannel *)
                 std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::begin
                           ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                            in_stack_fffffffffffff9d8);
            local_440 = (NDeviceChannel *)
                        std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::end
                                  ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)
                                   in_stack_fffffffffffff9d8);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                                       *)in_stack_fffffffffffff9e0,
                                      (__normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                                       *)in_stack_fffffffffffff9d8), bVar2) {
              local_448 = __gnu_cxx::
                          __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
                          ::operator*(&local_438);
              iVar4 = NDeviceChannel::getType(local_448);
              if (iVar4 == 0) {
                NDevice::getName_abi_cxx11_((NDevice *)in_stack_fffffffffffff9d8);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(iVar4,in_stack_fffffffffffff9e8),
                               (char *)in_stack_fffffffffffff9e0);
                NDeviceChannel::getId_abi_cxx11_((NDeviceChannel *)in_stack_fffffffffffff9d8);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(uVar3,in_stack_fffffffffffffa18),in_stack_fffffffffffffa10);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff9e0,(value_type *)in_stack_fffffffffffff9d8);
                std::__cxx11::string::~string(local_468);
                std::__cxx11::string::~string(local_4c8);
                std::__cxx11::string::~string(local_488);
                std::__cxx11::string::~string(local_4a8);
              }
              __gnu_cxx::
              __normal_iterator<NDeviceChannel_*,_std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>_>
              ::operator++(&local_438);
            }
            local_2b4 = 0xf;
            std::vector<NDeviceChannel,_std::allocator<NDeviceChannel>_>::~vector
                      ((vector<NDeviceChannel,_std::allocator<NDeviceChannel>_> *)paVar7);
            __gnu_cxx::__normal_iterator<NDevice_*,_std::vector<NDevice,_std::allocator<NDevice>_>_>
            ::operator++(local_400);
          }
          local_2b4 = 0xd;
          std::vector<NDevice,_std::allocator<NDevice>_>::~vector
                    ((vector<NDevice,_std::allocator<NDevice>_> *)paVar7);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff9e0,(char *)in_stack_fffffffffffff9d8);
          uVar6 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff9e8);
          if (bVar2) {
            this_00 = (TrodesConfig *)local_4e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)(local_4e9 + 1),"Format: \'ntrode_id, cluster\'",
                       (allocator *)this_00);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_00,(value_type *)in_stack_fffffffffffff9d8);
            std::__cxx11::string::~string((string *)(local_4e9 + 1));
            std::allocator<char>::~allocator((allocator<char> *)local_4e9);
            MlmWrap::getTrodesConfig(in_stack_fffffffffffff9d8);
            TrodesConfig::getNTrodes((TrodesConfig *)in_stack_fffffffffffff9d8);
            TrodesConfig::~TrodesConfig(this_00);
            local_4f8 = local_510;
            local_550[0]._M_current =
                 (NTrodeObj *)
                 std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::begin
                           ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)
                            in_stack_fffffffffffff9d8);
            local_558 = (NTrodeObj *)
                        std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::end
                                  ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)
                                   in_stack_fffffffffffff9d8);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                                       *)this_00,
                                      (__normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                                       *)in_stack_fffffffffffff9d8), bVar2) {
              local_560 = __gnu_cxx::
                          __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>
                          ::operator*(local_550);
              NTrodeObj::getId_abi_cxx11_((NTrodeObj *)in_stack_fffffffffffff9d8);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff9ec,uVar6),(char *)this_00);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00,(value_type *)in_stack_fffffffffffff9d8);
              std::__cxx11::string::~string(local_580);
              std::__cxx11::string::~string(local_5a0);
              __gnu_cxx::
              __normal_iterator<NTrodeObj_*,_std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>_>::
              operator++(local_550);
            }
            local_2b4 = 0x11;
            std::vector<NTrodeObj,_std::allocator<NTrodeObj>_>::~vector
                      ((vector<NTrodeObj,_std::allocator<NTrodeObj>_> *)in_stack_fffffffffffff9f0);
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> AbstractModuleClient::getAvailableTrodesData(std::string data){
    std::vector<std::string> list;
    if(data == hfType_NEURO){
        list.push_back("Format: 'ntrode_id, nth channel'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            for(size_t ch = 0; ch < nt.getHw_chans().size(); ch++){
                list.push_back(nt.getId() + "," + std::to_string(ch+1));
            }
        }
    }
    else if(data == hfType_LFP){
        list.push_back("Format: 'ntrode_id'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            list.push_back(nt.getId());
        }
    }
    else if(data == hfType_ANALOG){
        list.push_back("Format: 'Device_name, channel_id'");
        for(auto &dv : getTrodesConfig().getDevices()){
            for(auto &ch : dv.getChannels()){
                if(ch.getType() == 1)
                    list.push_back(dv.getName() + "," + ch.getId());
            }
        }
    }
    else if(data == hfType_DIGITAL){
        list.push_back("Format: 'Device_name, channel_id'");
        for(auto &dv : getTrodesConfig().getDevices()){
            for(auto &ch : dv.getChannels()){
                if(ch.getType() == 0)
                    list.push_back(dv.getName() + "," + ch.getId());
            }
        }
    }
    else if(data == hfType_SPIKE){
        list.push_back("Format: 'ntrode_id, cluster'");
        for(auto &nt : getTrodesConfig().getNTrodes()){
            list.push_back(nt.getId() + ", [0-8]");
        }
    }
    return list;
}